

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::StepperPrivate::makeClick(StepperPrivate *this)

{
  StepperPrivate *this_local;
  
  if (this->button == Minus) {
    if ((this->minusButtonEnabled & 1U) != 0) {
      Stepper::stepBy(this->q,-1);
    }
  }
  else if ((this->button == Plus) && ((this->plusButtonEnabled & 1U) != 0)) {
    Stepper::stepBy(this->q,1);
  }
  return;
}

Assistant:

void
StepperPrivate::makeClick()
{
	switch( button )
	{
		case StepperPrivate::Minus :
		{
			if( minusButtonEnabled )
				q->stepBy( -1 );
		}
			break;

		case StepperPrivate::Plus :
		{
			if( plusButtonEnabled )
				q->stepBy( 1 );
		}
			break;

		default:
			break;
	}
}